

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::readComment(Reader *this)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  Location end;
  CommentPlacement placement;
  
  pcVar2 = this->current_;
  if (pcVar2 == this->end_) {
    return false;
  }
  this->current_ = pcVar2 + 1;
  cVar1 = *pcVar2;
  if (cVar1 == '*') {
    bVar3 = readCStyleComment(this);
    if (!bVar3) {
      return false;
    }
  }
  else {
    if (cVar1 != '/') {
      return false;
    }
    readCppStyleComment(this);
  }
  if (this->collectComments_ != true) {
    return true;
  }
  end = pcVar2 + -1;
  placement = commentBefore;
  if (((this->lastValueEnd_ != (Location)0x0) &&
      (bVar3 = containsNewLine(this->lastValueEnd_,end), placement = commentBefore, !bVar3)) &&
     ((cVar1 != '*' || (bVar3 = containsNewLine(end,this->current_), !bVar3)))) {
    placement = commentAfterOnSameLine;
  }
  addComment(this,end,this->current_,placement);
  return true;
}

Assistant:

bool Reader::readComment() {
  Location commentBegin = current_ - 1;
  Char c = getNextChar();
  bool successful = false;
  if (c == '*')
    successful = readCStyleComment();
  else if (c == '/')
    successful = readCppStyleComment();
  if (!successful)
    return false;

  if (collectComments_) {
    CommentPlacement placement = commentBefore;
    if (lastValueEnd_ && !containsNewLine(lastValueEnd_, commentBegin)) {
      if (c != '*' || !containsNewLine(commentBegin, current_))
        placement = commentAfterOnSameLine;
    }

    addComment(commentBegin, current_, placement);
  }
  return true;
}